

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O3

Node * __thiscall
Parser::createImportVarDeclarationNode
          (Parser *this,vector<Node_*,_std::allocator<Node_*>_> *var_keys)

{
  pointer *pppNVar1;
  Token *pTVar2;
  iterator __position;
  Node *this_00;
  Node *this_01;
  ulong uVar3;
  long lVar4;
  pointer ppNVar5;
  Node *declarator;
  Node *local_48;
  vector<Node*,std::allocator<Node*>> *local_40;
  Parser *local_38;
  
  this_00 = (Node *)operator_new(0x30);
  local_38 = this;
  CompilationContext::Poolable::Poolable((Poolable *)this_00,this->ctx);
  this_00->tok = &emptyToken;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->nodeType = PNT_IMPORT_VAR_DECLARATION;
  ppNVar5 = (var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppNVar5) {
    local_40 = (vector<Node*,std::allocator<Node*>> *)&this_00->children;
    lVar4 = 0;
    uVar3 = 0;
    do {
      this_01 = (Node *)operator_new(0x30);
      pTVar2 = ppNVar5[uVar3]->tok;
      CompilationContext::Poolable::Poolable((Poolable *)this_01,local_38->ctx);
      this_01->tok = pTVar2;
      (this_01->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_01->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_01->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_01->nodeType = PNT_VAR_DECLARATOR;
      local_48 = this_01;
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)&this_01->children,(iterator)0x0,
                 (Node **)((long)(var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar4));
      __position._M_current =
           (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  (local_40,__position,&local_48);
      }
      else {
        *__position._M_current = local_48;
        pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
      uVar3 = uVar3 + 1;
      ppNVar5 = (var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 8;
    } while (uVar3 < (ulong)((long)(var_keys->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar5 >> 3));
  }
  return this_00;
}

Assistant:

Node * createImportVarDeclarationNode(vector<Node *> var_keys)
  {
    Node * n = new Node(ctx, emptyToken);
    n->nodeType = PNT_IMPORT_VAR_DECLARATION;

    for (size_t i = 0; i < var_keys.size(); i++)
    {
      Node * declarator = new Node(ctx, var_keys[i]->tok);
      declarator->nodeType = PNT_VAR_DECLARATOR;
      declarator->children.push_back(var_keys[i]);
      n->children.push_back(declarator);
    }

    return n;
  }